

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O2

Pair * ZXing::OneD::ReadPair(Pair *__return_storage_ptr__,PatternView *view,bool rightPair)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Character CVar5;
  Character CVar6;
  PatternView local_50;
  
  local_50._data = view->_data + 8;
  local_50._size = 5;
  local_50._base = view->_base;
  local_50._end = view->_end;
  iVar1 = ParseFinderPattern(&local_50,rightPair);
  if (iVar1 != 0) {
    lVar4 = 0;
    if (rightPair) {
      lVar4 = 0x1a;
    }
    local_50._data = (Iterator)(lVar4 + (long)view->_data);
    local_50._size = 8;
    local_50._base = view->_base;
    local_50._end = view->_end;
    CVar5 = ReadDataCharacter(&local_50,true,rightPair);
    if (CVar5.value != -1) {
      lVar4 = 0x1a;
      if (rightPair) {
        lVar4 = 0;
      }
      local_50._data = (Iterator)(lVar4 + (long)view->_data);
      local_50._size = 8;
      local_50._base = view->_base;
      local_50._end = view->_end;
      CVar6 = ReadDataCharacter(&local_50,false,rightPair);
      if (CVar6.value != -1) {
        iVar2 = PatternView::pixelsInFront(view);
        iVar2 = iVar2 - (uint)view->_data[-1];
        iVar3 = PatternView::pixelsTillEnd(view);
        iVar3 = iVar3 + (uint)view->_data[0x15] * 2;
        __return_storage_ptr__->left = CVar5;
        __return_storage_ptr__->right = CVar6;
        goto LAB_00170894;
      }
    }
  }
  iVar3 = 1;
  (__return_storage_ptr__->left).value = -1;
  (__return_storage_ptr__->left).checksum = 0;
  (__return_storage_ptr__->right).value = -1;
  (__return_storage_ptr__->right).checksum = 0;
  iVar2 = -1;
  iVar1 = 0;
LAB_00170894:
  __return_storage_ptr__->finder = iVar1;
  __return_storage_ptr__->xStart = iVar2;
  __return_storage_ptr__->xStop = iVar3;
  __return_storage_ptr__->y = -1;
  __return_storage_ptr__->count = 1;
  return __return_storage_ptr__;
}

Assistant:

static Pair ReadPair(const PatternView& view, bool rightPair)
{
	if (int pattern = ParseFinderPattern(Finder(view), rightPair))
		if (auto outside = ReadDataCharacter(rightPair ? RightChar(view) : LeftChar(view), true, rightPair))
			if (auto inside = ReadDataCharacter(rightPair ? LeftChar(view) : RightChar(view), false, rightPair)) {
				// include left and right guards
				int xStart = view.pixelsInFront() - view[-1];
				int xStop  = view.pixelsTillEnd() + 2 * view[FULL_PAIR_SIZE];
				return {outside, inside, pattern, xStart, xStop};
			}

	return {};
}